

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

int __thiscall
soplex::
LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remove(LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,char *__filename)

{
  int iVar1;
  int extraout_EAX;
  cpp_dec_float<100U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  int *piVar3;
  cpp_dec_float<100U,_int,_void> *v;
  int newsize;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff60;
  cpp_dec_float<100U,_int,_void> *this_01;
  
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::remove(&this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,(char *)((ulong)__filename & 0xffffffff));
  v = (cpp_dec_float<100U,_int,_void> *)&this->low;
  num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x4fa4d8);
  this_00 = &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[](in_stack_ffffffffffffff60,(int)((ulong)v >> 0x20))->m_backend;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this_00,(int)((ulong)v >> 0x20));
  this_01 = this_00;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,v);
  num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x4fa53f);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this_00,(int)((ulong)v >> 0x20));
  pnVar2 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)this_00,(int)((ulong)v >> 0x20));
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,v);
  num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x4fa5aa);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this_00,(int)((ulong)v >> 0x20));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)this_00,(int)((ulong)v >> 0x20));
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,v);
  newsize = (int)((ulong)v >> 0x20);
  iVar1 = num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x4fa60f);
  piVar3 = DataArray<int>::operator[](&this->scaleExp,iVar1);
  iVar1 = *piVar3;
  piVar3 = DataArray<int>::operator[](&this->scaleExp,(int)__filename);
  *piVar3 = iVar1;
  num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x4fa652);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this_01,(int)((ulong)pnVar2 >> 0x20),SUB81((ulong)pnVar2 >> 0x18,0));
  num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x4fa67b);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this_01,(int)((ulong)pnVar2 >> 0x20),SUB81((ulong)pnVar2 >> 0x18,0));
  num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x4fa6a4);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this_01,(int)((ulong)pnVar2 >> 0x20),SUB81((ulong)pnVar2 >> 0x18,0));
  num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x4fa6cd);
  DataArray<int>::reSize((DataArray<int> *)this_00,newsize);
  return extraout_EAX;
}

Assistant:

void remove(int i)
   {
      SVSetBase<R>::remove(i);
      low[i] = low[num()];
      up[i] = up[num()];
      object[i] = object[num()];
      scaleExp[i] = scaleExp[num()];
      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }